

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O1

void ACIWnd::MoveAllVR(bool bIntoVR)

{
  LTImgWindow *pLVar1;
  WndMode WVar2;
  undefined7 in_register_00000039;
  _List_node_base *p_Var3;
  
  p_Var3 = listACIWnd_abi_cxx11_.super__List_base<ACIWnd_*,_std::allocator<ACIWnd_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if ((int)CONCAT71(in_register_00000039,bIntoVR) == 0) {
    for (; p_Var3 != (_List_node_base *)&listACIWnd_abi_cxx11_;
        p_Var3 = (((_List_base<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)&p_Var3->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next) {
      pLVar1 = (LTImgWindow *)p_Var3[1]._M_next;
      WVar2 = LTImgWindow::GetMode(pLVar1);
      if (WVar2 == WND_MODE_VR) {
        LTImgWindow::SetMode(pLVar1,WND_MODE_FLOAT);
      }
    }
  }
  else {
    for (; p_Var3 != (_List_node_base *)&listACIWnd_abi_cxx11_;
        p_Var3 = (((_List_base<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)&p_Var3->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next) {
      pLVar1 = (LTImgWindow *)p_Var3[1]._M_next;
      WVar2 = LTImgWindow::GetMode(pLVar1);
      if (WVar2 == WND_MODE_FLOAT) {
        LTImgWindow::SetMode(pLVar1,WND_MODE_VR);
      }
    }
  }
  return;
}

Assistant:

void ACIWnd::MoveAllVR (bool bIntoVR)
{
    // move into VR
    if (bIntoVR) {
        for (ACIWnd* pWnd: listACIWnd) {
            if (pWnd->GetMode() == WND_MODE_FLOAT)
                pWnd->SetMode(WND_MODE_VR);
        }
    }
    // move out of VR
    else {
        for (ACIWnd* pWnd: listACIWnd) {
            if (pWnd->GetMode() == WND_MODE_VR)
                pWnd->SetMode(WND_MODE_FLOAT);
        }
    }
}